

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  size_t count;
  
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  count = 0;
  do {
    puVar1[count] = (uint)n;
    count = count + 1;
    n = n >> 0x20;
  } while (n != 0);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,count);
  this->exp_ = 0;
  return;
}

Assistant:

void assign(uint64_t n) {
    size_t num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }